

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O0

int Disconnectublox(UBLOX *publox)

{
  int iVar1;
  size_t sVar2;
  UBLOX *publox_local;
  
  if (publox->bSendStopSentence != 0) {
    sVar2 = strlen(publox->szStopSentence);
    iVar1 = TransferToublox(publox,(uchar *)publox->szStopSentence,(int)sVar2);
    if (iVar1 != 0) {
      printf("Error while disconnecting a ublox.\n");
      CloseRS232Port(&publox->RS232Port);
      return 1;
    }
    mSleep(0x32);
  }
  iVar1 = CloseRS232Port(&publox->RS232Port);
  if (iVar1 == 0) {
    printf("ublox disconnected.\n");
  }
  else {
    printf("ublox disconnection failed.\n");
  }
  publox_local._4_4_ = (uint)(iVar1 != 0);
  return publox_local._4_4_;
}

Assistant:

inline int Disconnectublox(UBLOX* publox)
{
	if (publox->bSendStopSentence)
	{
		if (TransferToublox(publox, (unsigned char*)publox->szStopSentence, (int)strlen(publox->szStopSentence)) != EXIT_SUCCESS)
		{
			printf("Error while disconnecting a ublox.\n");
			CloseRS232Port(&publox->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(50);
	}
	if (CloseRS232Port(&publox->RS232Port) != EXIT_SUCCESS)
	{
		printf("ublox disconnection failed.\n");
		return EXIT_FAILURE;
	}

	printf("ublox disconnected.\n");

	return EXIT_SUCCESS;
}